

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O2

bool __thiscall
Dielectric::Scatter(Dielectric *this,Ray *ray_in,hit_record_t *hit_record,Vec3 *attenuation,
                   Ray *ray_out)

{
  undefined8 uVar1;
  Texture *pTVar2;
  double dVar3;
  bool bVar4;
  Vec3 *pVVar5;
  float fVar6;
  float fVar7;
  uint extraout_XMM0_Db;
  float fVar8;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  float fVar9;
  Vec3 _reflected;
  Vec3 _refracted;
  Vec3 local_88;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float local_64;
  Ray *local_60;
  Vec3 local_54;
  Vec3 local_48;
  Vec3 local_3c;
  
  local_88.e._0_8_ = *(undefined8 *)(ray_in->m_direction).e;
  local_88.e[2] = (ray_in->m_direction).e[2];
  local_60 = ray_out;
  reflect(&local_54,&local_88);
  pTVar2 = (this->super_Material).m_albedo;
  (*pTVar2->_vptr_Texture[2])(hit_record->m_u,&local_88,pTVar2,&hit_record->m_point);
  attenuation->e[2] = local_88.e[2];
  *(undefined8 *)attenuation->e = local_88.e._0_8_;
  local_88.e._0_8_ = *(undefined8 *)(ray_in->m_direction).e;
  local_88.e[2] = (ray_in->m_direction).e[2];
  fVar6 = dot(&local_88,&hit_record->m_normal);
  if (fVar6 <= 0.0) {
    local_88.e[2] = (hit_record->m_normal).e[2];
    local_88.e._0_8_ = *(undefined8 *)(hit_record->m_normal).e;
    fVar9 = 1.0 / this->m_ref_idx;
    uStack_74 = extraout_XMM0_Db ^ 0x80000000;
    uStack_70 = extraout_XMM0_Dc ^ 0x80000000;
    uStack_6c = extraout_XMM0_Dd ^ 0x80000000;
    uVar1 = *(undefined8 *)(ray_in->m_direction).e;
    fVar7 = (float)uVar1;
    fVar8 = (float)((ulong)uVar1 >> 0x20);
    local_48.e[2] = (ray_in->m_direction).e[2];
    local_78 = -fVar6 / SQRT(local_48.e[2] * local_48.e[2] + fVar7 * fVar7 + fVar8 * fVar8);
  }
  else {
    local_88.e[2] = -(hit_record->m_normal).e[2];
    local_88.e._0_8_ = *(ulong *)(hit_record->m_normal).e ^ 0x8000000080000000;
    local_78 = this->m_ref_idx;
    fVar9 = (ray_in->m_direction).e[0];
    fVar7 = (ray_in->m_direction).e[1];
    fVar8 = (ray_in->m_direction).e[2];
    fVar6 = fVar6 / SQRT(fVar8 * fVar8 + fVar9 * fVar9 + fVar7 * fVar7);
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    fVar6 = 1.0 - local_78 * local_78 * (1.0 - fVar6 * fVar6);
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
      uStack_74 = extraout_XMM0_Db_00;
      uStack_70 = extraout_XMM0_Dc_00;
      uStack_6c = extraout_XMM0_Dd_00;
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    uVar1 = *(undefined8 *)(ray_in->m_direction).e;
    fVar7 = (float)uVar1;
    fVar8 = (float)((ulong)uVar1 >> 0x20);
    local_48.e[2] = (ray_in->m_direction).e[2];
    fVar9 = local_78;
    local_78 = fVar6;
  }
  local_48.e[1] = fVar8;
  local_48.e[0] = fVar7;
  bVar4 = refract(&local_48,&local_88,fVar9,&local_3c);
  if (bVar4) {
    local_64 = (1.0 - this->m_ref_idx) / (this->m_ref_idx + 1.0);
    local_64 = local_64 * local_64;
    local_68 = 1.0 - local_64;
    fVar6 = powf(1.0 - local_78,5.0);
    local_78 = fVar6 * local_68 + local_64;
  }
  else {
    local_78 = 1.0;
  }
  dVar3 = drand48();
  pVVar5 = &local_3c;
  if ((float)dVar3 < local_78) {
    pVVar5 = &local_54;
  }
  fVar6 = pVVar5->e[0];
  uVar1 = *(undefined8 *)(pVVar5->e + 1);
  fVar9 = ray_in->m_time;
  fVar7 = (hit_record->m_point).e[2];
  *(undefined8 *)(local_60->m_origin).e = *(undefined8 *)(hit_record->m_point).e;
  (local_60->m_origin).e[2] = fVar7;
  (local_60->m_direction).e[0] = fVar6;
  *(undefined8 *)((local_60->m_direction).e + 1) = uVar1;
  local_60->m_time = fVar9;
  return true;
}

Assistant:

bool
Dielectric::Scatter(const Ray& ray_in, hit_record_t& hit_record, Vec3& attenuation, Ray& ray_out) const
{
    Vec3 _reflected = reflect(ray_in.GetDirection(), hit_record.m_normal);
    attenuation     = m_albedo->GetValue(hit_record.m_u, hit_record.m_v, hit_record.m_point);
    
    float angle;
    float cosine;
    float ni_over_nt;
    Vec3  outward_normal;
    
    if ((angle = dot(ray_in.GetDirection(), hit_record.m_normal)) > 0.0f) {
        outward_normal = -hit_record.m_normal;
        ni_over_nt     = m_ref_idx;
        cosine = angle / ray_in.GetDirection().length(); // cosine *= m_ref_idx;
        cosine = sqrt(1.0f - m_ref_idx*m_ref_idx*(1.0f - cosine*cosine));
    }
    else {
        outward_normal = hit_record.m_normal;
        ni_over_nt     = 1.0f / m_ref_idx;
        cosine         = -angle / ray_in.GetDirection().length();
    }

    Vec3  _refracted;
    float _reflect_prob = 1.0f;
    if (refract(ray_in.GetDirection(), outward_normal, ni_over_nt, _refracted)) {
        _reflect_prob = schlick(cosine, m_ref_idx);
    }

    Vec3  _scattered = (RANDOM_GEN() < _reflect_prob) ? _reflected : _refracted;
    ray_out          = Ray(hit_record.m_point, _scattered, ray_in.GetTime());
    
    return true;
}